

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O0

void __thiscall btDbvtTreeCollider::Process(btDbvtTreeCollider *this,btDbvtNode *na,btDbvtNode *nb)

{
  long *plVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  btDbvtProxy *pb;
  btDbvtProxy *pa;
  
  if (in_RSI != in_RDX) {
    plVar1 = *(long **)(*(long *)(in_RDI + 8) + 0xe0);
    (**(code **)(*plVar1 + 0x10))
              (plVar1,*(undefined8 *)(in_RSI + 0x28),*(undefined8 *)(in_RDX + 0x28));
    *(int *)(*(long *)(in_RDI + 8) + 0xfc) = *(int *)(*(long *)(in_RDI + 8) + 0xfc) + 1;
  }
  return;
}

Assistant:

void	Process(const btDbvtNode* na,const btDbvtNode* nb)
	{
		if(na!=nb)
		{
			btDbvtProxy*	pa=(btDbvtProxy*)na->data;
			btDbvtProxy*	pb=(btDbvtProxy*)nb->data;
#if DBVT_BP_SORTPAIRS
			if(pa->m_uniqueId>pb->m_uniqueId) 
				btSwap(pa,pb);
#endif
			pbp->m_paircache->addOverlappingPair(pa,pb);
			++pbp->m_newpairs;
		}
	}